

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int ZSTD_disableLiteralsCompression(ZSTD_CCtx_params *cctxParams)

{
  ZSTD_literalCompressionMode_e ZVar1;
  bool local_1d;
  ZSTD_CCtx_params *cctxParams_local;
  
  ZVar1 = cctxParams->literalCompressionMode;
  if (ZVar1 == ZSTD_lcm_auto) {
    local_1d = false;
    if ((cctxParams->cParams).strategy == ZSTD_fast) {
      local_1d = (cctxParams->cParams).targetLength != 0;
    }
    cctxParams_local._4_4_ = (uint)local_1d;
  }
  else if (ZVar1 == ZSTD_lcm_huffman) {
    cctxParams_local._4_4_ = 0;
  }
  else {
    if (ZVar1 != ZSTD_lcm_uncompressed) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x31d9,"int ZSTD_disableLiteralsCompression(const ZSTD_CCtx_params *)");
    }
    cctxParams_local._4_4_ = 1;
  }
  return cctxParams_local._4_4_;
}

Assistant:

static int ZSTD_disableLiteralsCompression(const ZSTD_CCtx_params* cctxParams)
{
    switch (cctxParams->literalCompressionMode) {
    case ZSTD_lcm_huffman:
        return 0;
    case ZSTD_lcm_uncompressed:
        return 1;
    default:
        assert(0 /* impossible: pre-validated */);
        /* fall-through */
    case ZSTD_lcm_auto:
        return (cctxParams->cParams.strategy == ZSTD_fast) && (cctxParams->cParams.targetLength > 0);
    }
}